

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathFloorFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  double dVar1;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 1) {
      if (ctxt->valueNr < 1) {
        xmlXPathErr(ctxt,0x17);
      }
      else {
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_NUMBER)) {
          xmlXPathNumberFunction(ctxt,1);
        }
        if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NUMBER)) {
          xmlXPathErr(ctxt,0xb);
        }
        else {
          dVar1 = floor(ctxt->value->floatval);
          ctxt->value->floatval = dVar1;
        }
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

void
xmlXPathFloorFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    CHECK_ARITY(1);
    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);

    ctxt->value->floatval = floor(ctxt->value->floatval);
}